

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_add_element(p_ply ply,char *name,long ninstances)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  sVar1 = strlen(name);
  if ((ninstances < 0) || (0xff < sVar1)) {
    iVar2 = 0;
    ply_ferror(ply,"Invalid arguments");
  }
  else {
    __dest = (char *)ply_grow_array(ply,&ply->element,&ply->nelements,0x118);
    iVar2 = 0;
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      *__dest = '\0';
      __dest[0x100] = '\0';
      __dest[0x101] = '\0';
      __dest[0x102] = '\0';
      __dest[0x103] = '\0';
      __dest[0x104] = '\0';
      __dest[0x105] = '\0';
      __dest[0x106] = '\0';
      __dest[0x107] = '\0';
      __dest[0x108] = '\0';
      __dest[0x109] = '\0';
      __dest[0x10a] = '\0';
      __dest[0x10b] = '\0';
      __dest[0x10c] = '\0';
      __dest[0x10d] = '\0';
      __dest[0x10e] = '\0';
      __dest[0x10f] = '\0';
      __dest[0x110] = '\0';
      __dest[0x111] = '\0';
      __dest[0x112] = '\0';
      __dest[0x113] = '\0';
      __dest[0x114] = '\0';
      __dest[0x115] = '\0';
      __dest[0x116] = '\0';
      __dest[0x117] = '\0';
    }
    if (__dest != (char *)0x0) {
      strcpy(__dest,name);
      *(long *)(__dest + 0x100) = ninstances;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ply_add_element(p_ply ply, const char *name, long ninstances) {
    p_ply_element element = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE && ninstances >= 0);
    if (strlen(name) >= WORDSIZE || ninstances < 0) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = ply_grow_element(ply);
    if (!element) return 0;
    strcpy(element->name, name);
    element->ninstances = ninstances;
    return 1;
}